

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O3

char * __thiscall xe::TestResultParser::getAttribute(TestResultParser *this,char *name)

{
  bool bVar1;
  char *pcVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  bVar1 = xml::Parser::hasAttribute(&this->m_xmlParser,name);
  if (bVar1) {
    pcVar2 = xml::Parser::getAttribute(&this->m_xmlParser,name);
    return pcVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Missing attribute \'","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_90);
  local_70 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_70 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_50 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_d0 == plVar4) {
    local_c0 = *plVar4;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar4;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_b0 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_b0);
  *(undefined ***)this_00 = &PTR__runtime_error_0011b830;
  __cxa_throw(this_00,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const char* TestResultParser::getAttribute (const char* name)
{
	if (!m_xmlParser.hasAttribute(name))
		throw TestResultParseError(string("Missing attribute '") + name + "' in <" + m_xmlParser.getElementName() + ">");

	return m_xmlParser.getAttribute(name);
}